

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_socket.c
# Opt level: O1

int amqp_simple_wait_frame_noblock
              (amqp_connection_state_t state,amqp_frame_t *decoded_frame,timeval *timeout)

{
  amqp_link_t *paVar1;
  amqp_link_t_ *paVar2;
  undefined8 *puVar3;
  undefined8 uVar4;
  size_t sVar5;
  void *pvVar6;
  void *pvVar7;
  void *pvVar8;
  int iVar9;
  int iVar10;
  uint64_t start;
  ulong uVar11;
  char *fmt;
  ulong uVar12;
  bool bVar13;
  int iStack_84;
  timeval *ptStack_80;
  timeval tStack_78;
  amqp_frame_t aStack_60;
  
  paVar1 = state->first_queued_frame;
  if (paVar1 != (amqp_link_t *)0x0) {
    paVar2 = paVar1->next;
    puVar3 = (undefined8 *)paVar1->data;
    state->first_queued_frame = paVar2;
    if (paVar2 == (amqp_link_t_ *)0x0) {
      state->last_queued_frame = (amqp_link_t *)0x0;
    }
    uVar4 = *puVar3;
    sVar5 = puVar3[1];
    pvVar6 = (void *)puVar3[2];
    pvVar7 = (void *)puVar3[3];
    pvVar8 = (void *)puVar3[5];
    (decoded_frame->payload).properties.raw.len = puVar3[4];
    (decoded_frame->payload).properties.raw.bytes = pvVar8;
    (decoded_frame->payload).method.decoded = pvVar6;
    (decoded_frame->payload).properties.decoded = pvVar7;
    decoded_frame->frame_type = (char)uVar4;
    decoded_frame->field_0x1 = (char)((ulong)uVar4 >> 8);
    decoded_frame->channel = (short)((ulong)uVar4 >> 0x10);
    *(int *)&decoded_frame->field_0x4 = (int)((ulong)uVar4 >> 0x20);
    (decoded_frame->payload).body_fragment.len = sVar5;
    return 0;
  }
  if ((timeout != (timeval *)0x0) && ((timeout->tv_sec < 0 || (timeout->tv_usec < 0)))) {
    return -10;
  }
  start = 0;
  uVar11 = 0;
  uVar12 = 0;
  ptStack_80 = (timeval *)0x0;
LAB_0010ae30:
  do {
    if (state->sock_inbound_limit <= state->sock_inbound_offset) {
      do {
        if ((timeout != (timeval *)0x0) || (0 < state->heartbeat)) {
          start = amqp_get_monotonic_timestamp();
          if (start == 0) {
            iStack_84 = -0xe;
            start = 0;
LAB_0010af34:
            bVar13 = false;
          }
          else {
            if ((0 < state->heartbeat) && (state->next_send_heartbeat < start)) {
              aStack_60.channel = 0;
              aStack_60.frame_type = '\b';
              iVar10 = amqp_send_frame(state,&aStack_60);
              if (iVar10 == 0) {
                start = amqp_get_monotonic_timestamp();
                bVar13 = start != 0;
                if (!bVar13) {
                  iStack_84 = -0xe;
                }
              }
              else {
                bVar13 = false;
                iStack_84 = iVar10;
              }
              if (!bVar13) goto LAB_0010af34;
            }
            if (timeout != (timeval *)0x0) {
              if (uVar11 == 0) {
                uVar11 = timeout->tv_usec * 1000 + timeout->tv_sec * 1000000000 + start;
              }
              if (uVar11 < start) {
                iStack_84 = -0xd;
                goto LAB_0010af34;
              }
            }
            if (state->heartbeat < 1) {
              uVar12 = uVar11;
              if (timeout == (timeval *)0x0) {
                fmt = "Internal error: both timeout == NULL && state->heartbeat == 0";
                goto LAB_0010b058;
              }
            }
            else {
              if (state->next_recv_heartbeat < start) {
                state->next_recv_heartbeat = start;
              }
              uVar12 = state->next_send_heartbeat;
              if (state->next_recv_heartbeat < state->next_send_heartbeat) {
                uVar12 = state->next_recv_heartbeat;
              }
              if ((timeout != (timeval *)0x0) && (uVar11 < uVar12)) {
                uVar12 = uVar11;
              }
            }
            tStack_78.tv_sec = (uVar12 - start) / 1000000000;
            tStack_78.tv_usec = ((uVar12 - start) % 1000000000) / 1000;
            bVar13 = true;
            ptStack_80 = &tStack_78;
          }
          if (!bVar13) {
            bVar13 = false;
            goto LAB_0010b036;
          }
        }
        iVar10 = recv_with_timeout(state,start,ptStack_80);
        if (iVar10 != -0xd) {
          if (iVar10 != 0) goto LAB_0010b02c;
          bVar13 = true;
          goto LAB_0010b036;
        }
        if (uVar12 == state->next_recv_heartbeat) {
          (*state->socket->klass->close)(state->socket);
          iVar10 = -0xf;
          goto LAB_0010b02c;
        }
        if (uVar12 == uVar11) goto code_r0x0010b005;
        if (uVar12 != state->next_send_heartbeat) {
          fmt = "Internal error: unable to determine timeout reason";
LAB_0010b058:
          amqp_abort(fmt);
        }
      } while( true );
    }
    iVar9 = consume_one_frame(state,decoded_frame);
    iVar10 = 0;
    if (iVar9 != 0) {
      bVar13 = false;
      iStack_84 = iVar9;
      goto LAB_0010b036;
    }
    if (decoded_frame->frame_type != '\0') {
      if (decoded_frame->frame_type != '\b') goto LAB_0010b02c;
      amqp_maybe_release_buffers_on_channel(state,0);
    }
  } while( true );
code_r0x0010b005:
  iVar10 = -0xd;
LAB_0010b02c:
  bVar13 = false;
  iStack_84 = iVar10;
LAB_0010b036:
  if (!bVar13) {
    return iStack_84;
  }
  goto LAB_0010ae30;
}

Assistant:

int amqp_simple_wait_frame_noblock(amqp_connection_state_t state,
                                   amqp_frame_t *decoded_frame,
                                   struct timeval *timeout)
{
  if (state->first_queued_frame != NULL) {
    amqp_frame_t *f = (amqp_frame_t *) state->first_queued_frame->data;
    state->first_queued_frame = state->first_queued_frame->next;
    if (state->first_queued_frame == NULL) {
      state->last_queued_frame = NULL;
    }
    *decoded_frame = *f;
    return AMQP_STATUS_OK;
  } else {
    return wait_frame_inner(state, decoded_frame, timeout);
  }
}